

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_verify.c
# Opt level: O1

int main(int argc,char **argv)

{
  int ret;
  int iVar1;
  FILE *__stream;
  size_t sig_len;
  mbedtls_md_info_t *md_info;
  mbedtls_pk_context pk;
  uchar hash [32];
  char filename [512];
  uchar buf [1024];
  mbedtls_pk_context mStack_658;
  uchar local_648 [32];
  char local_628 [512];
  uchar local_428 [1024];
  
  mbedtls_pk_init(&mStack_658);
  if (argc == 3) {
    printf("\n  . Reading public key from \'%s\'",argv[1]);
    fflush(_stdout);
    ret = mbedtls_pk_parse_public_keyfile(&mStack_658,argv[1]);
    if (ret != 0) {
      printf(" failed\n  ! mbedtls_pk_parse_public_keyfile returned -0x%04x\n",(ulong)(uint)-ret);
      goto LAB_0010a308;
    }
    snprintf(local_628,0x200,"%s.sig",argv[2]);
    __stream = fopen(local_628,"rb");
    if (__stream != (FILE *)0x0) {
      sig_len = fread(local_428,1,0x400,__stream);
      fclose(__stream);
      printf("\n  . Verifying the SHA-256 signature");
      fflush(_stdout);
      md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
      ret = mbedtls_md_file(md_info,argv[2],local_648);
      if (ret == 0) {
        ret = 0;
        iVar1 = mbedtls_pk_verify(&mStack_658,MBEDTLS_MD_SHA256,local_648,0,local_428,sig_len);
        if (iVar1 == 0) {
          puts("\n  . OK (the signature is valid)\n");
        }
        else {
          printf(" failed\n  ! mbedtls_pk_verify returned -0x%04x\n",(ulong)(uint)-iVar1);
          ret = iVar1;
        }
      }
      else {
        printf(" failed\n  ! Could not open or read %s\n\n",argv[2]);
      }
      goto LAB_0010a308;
    }
    printf("\n  ! Could not open %s\n\n",local_628);
  }
  else {
    puts("usage: mbedtls_pk_verify <key_file> <filename>");
  }
  ret = 1;
LAB_0010a308:
  mbedtls_pk_free(&mStack_658);
  if (ret != 0) {
    mbedtls_strerror(ret,(char *)local_428,0x400);
    printf("  !  Last error was: %s\n",local_428);
  }
  return ret;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1;
    size_t i;
    mbedtls_pk_context pk;
    unsigned char hash[32];
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    char filename[512];

    mbedtls_pk_init( &pk );

    if( argc != 3 )
    {
        mbedtls_printf( "usage: mbedtls_pk_verify <key_file> <filename>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from '%s'", argv[1] );
    fflush( stdout );

    if( ( ret = mbedtls_pk_parse_public_keyfile( &pk, argv[1] ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_parse_public_keyfile returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Extract the signature from the file
     */
    ret = 1;
    mbedtls_snprintf( filename, sizeof(filename), "%s.sig", argv[2] );

    if( ( f = fopen( filename, "rb" ) ) == NULL )
    {
        mbedtls_printf( "\n  ! Could not open %s\n\n", filename );
        goto exit;
    }


    i = fread( buf, 1, sizeof(buf), f );

    fclose( f );

    /*
     * Compute the SHA-256 hash of the input file and
     * verify the signature
     */
    mbedtls_printf( "\n  . Verifying the SHA-256 signature" );
    fflush( stdout );

    if( ( ret = mbedtls_md_file(
                    mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ),
                    argv[2], hash ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not open or read %s\n\n", argv[2] );
        goto exit;
    }

    if( ( ret = mbedtls_pk_verify( &pk, MBEDTLS_MD_SHA256, hash, 0,
                           buf, i ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_verify returned -0x%04x\n", -ret );
        goto exit;
    }

    mbedtls_printf( "\n  . OK (the signature is valid)\n\n" );

    ret = 0;

exit:
    mbedtls_pk_free( &pk );

#if defined(MBEDTLS_ERROR_C)
    if( ret != 0 )
    {
        mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
        mbedtls_printf( "  !  Last error was: %s\n", buf );
    }
#endif

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}